

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

int gdImagePixelate(gdImagePtr im,int block_size,uint mode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int local_60;
  int local_5c;
  int b;
  int local_54;
  int local_50;
  
  if (block_size < 1) {
    return 0;
  }
  if (block_size != 1) {
    if (mode == 0) {
      for (iVar9 = 0; iVar9 < im->sy; iVar9 = iVar9 + block_size) {
        for (iVar8 = 0; iVar8 < im->sx; iVar8 = iVar8 + block_size) {
          iVar3 = gdImageBoundsSafe(im,iVar8,iVar9);
          if (iVar3 != 0) {
            iVar3 = gdImageGetPixel(im,iVar8,iVar9);
            gdImageFilledRectangle
                      (im,iVar8,iVar9,block_size + -1 + iVar8,block_size + -1 + iVar9,iVar3);
          }
        }
      }
      return 1;
    }
    if (mode != 1) {
      return 0;
    }
    for (iVar9 = 0; iVar9 < im->sy; iVar9 = iVar9 + block_size) {
      for (iVar8 = 0; iVar8 < im->sx; iVar8 = iVar8 + block_size) {
        local_54 = 0;
        local_60 = 0;
        local_5c = 0;
        b = 0;
        local_50 = 0;
        for (iVar3 = 0; iVar3 != block_size; iVar3 = iVar3 + 1) {
          for (iVar6 = 0; block_size != iVar6; iVar6 = iVar6 + 1) {
            iVar1 = gdImageBoundsSafe(im,iVar8 + iVar6,iVar3 + iVar9);
            if (iVar1 != 0) {
              uVar2 = gdImageGetPixel(im,iVar8 + iVar6,iVar3 + iVar9);
              if (im->trueColor == 0) {
                uVar4 = im->alpha[(int)uVar2];
                uVar5 = im->red[(int)uVar2];
                uVar7 = im->green[(int)uVar2];
                uVar2 = im->blue[(int)uVar2];
              }
              else {
                uVar4 = uVar2 >> 0x18 & 0x7f;
                uVar5 = uVar2 >> 0x10 & 0xff;
                uVar7 = uVar2 >> 8 & 0xff;
                uVar2 = uVar2 & 0xff;
              }
              local_60 = local_60 + uVar5;
              local_54 = local_54 + uVar4;
              local_5c = local_5c + uVar7;
              b = b + uVar2;
              local_50 = local_50 + 1;
            }
          }
        }
        if (0 < local_50) {
          iVar3 = gdImageColorResolveAlpha
                            (im,local_60 / local_50,local_5c / local_50,b / local_50,
                             local_54 / local_50);
          gdImageFilledRectangle
                    (im,iVar8,iVar9,block_size + -1 + iVar8,block_size + -1 + iVar9,iVar3);
        }
      }
    }
  }
  return 1;
}

Assistant:

BGD_DECLARE(int) gdImagePixelate(gdImagePtr im, int block_size, const unsigned int mode)
{
	int x, y;

	if (block_size <= 0) {
		return 0;
	} else if (block_size == 1) {
		return 1;
	}
	switch (mode) {
	case GD_PIXELATE_UPPERLEFT:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				if (gdImageBoundsSafe(im, x, y)) {
					int c = gdImageGetPixel(im, x, y);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	case GD_PIXELATE_AVERAGE:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				int a, r, g, b, c;
				int total;
				int cx, cy;

				a = r = g = b = c = total = 0;
				/* sampling */
				for (cy = 0; cy < block_size; cy++) {
					for (cx = 0; cx < block_size; cx++) {
						if (!gdImageBoundsSafe(im, x + cx, y + cy)) {
							continue;
						}
						c = gdImageGetPixel(im, x + cx, y + cy);
						a += gdImageAlpha(im, c);
						r += gdImageRed(im, c);
						g += gdImageGreen(im, c);
						b += gdImageBlue(im, c);
						total++;
					}
				}
				/* drawing */
				if (total > 0) {
					c = gdImageColorResolveAlpha(im, r / total, g / total, b / total, a / total);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	default:
		return 0;
	}
	return 1;
}